

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O3

bool SetGenericProperty<float>
               (map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
                *list,char *szName,float *value)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  uint uVar7;
  bool bVar8;
  pair<unsigned_int,_float> local_20;
  
  if (szName == (char *)0x0) {
    __assert_fail("nullptr != szName",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/GenericProperty.h"
                  ,0x3e,
                  "bool SetGenericProperty(std::map<unsigned int, T> &, const char *, const T &) [T = float]"
                 );
  }
  sVar4 = strlen(szName);
  uVar3 = (uint)sVar4;
  uVar7 = 0;
  if (3 < uVar3) {
    uVar2 = uVar3 >> 2;
    uVar7 = 0;
    do {
      uVar7 = (*(ushort *)szName + uVar7) * 0x10000 ^
              (uint)*(ushort *)((long)szName + 2) << 0xb ^ *(ushort *)szName + uVar7;
      szName = (char *)((long)szName + 4);
      uVar7 = (uVar7 >> 0xb) + uVar7;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  switch(uVar3 & 3) {
  case 0:
    goto switchD_0033cfc7_caseD_0;
  case 1:
    uVar7 = uVar7 + (int)(char)*(ushort *)szName;
    uVar3 = uVar7 * 0x400 ^ uVar7;
    uVar7 = uVar3 >> 1;
    break;
  case 2:
    uVar3 = (uVar7 + *(ushort *)szName) * 0x800 ^ uVar7 + *(ushort *)szName;
    uVar7 = uVar3 >> 0x11;
    break;
  case 3:
    uVar7 = (uVar7 + *(ushort *)szName) * 0x10000 ^
            (int)(char)*(ushort *)((long)szName + 2) << 0x12 ^ uVar7 + *(ushort *)szName;
    uVar7 = (uVar7 >> 0xb) + uVar7;
    goto switchD_0033cfc7_caseD_0;
  }
  uVar7 = uVar7 + uVar3;
switchD_0033cfc7_caseD_0:
  uVar7 = uVar7 * 8 ^ uVar7;
  uVar7 = (uVar7 >> 5) + uVar7;
  uVar7 = uVar7 * 0x10 ^ uVar7;
  uVar7 = (uVar7 >> 0x11) + uVar7;
  uVar7 = uVar7 * 0x2000000 ^ uVar7;
  local_20.first = (uVar7 >> 6) + uVar7;
  p_Var6 = (list->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var6 != (_Base_ptr)0x0) {
    p_Var1 = &(list->_M_t)._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      bVar8 = p_Var6[1]._M_color < local_20.first;
      if (!bVar8) {
        p_Var5 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[bVar8];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var5[1]._M_color <= local_20.first)) {
      *(float *)&p_Var5[1].field_0x4 = *value;
      return true;
    }
  }
  local_20.second = *value;
  std::
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,float>,std::_Select1st<std::pair<unsigned_int_const,float>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,float>>>
  ::_M_emplace_unique<std::pair<unsigned_int,float>>
            ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,float>,std::_Select1st<std::pair<unsigned_int_const,float>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,float>>>
              *)list,&local_20);
  return false;
}

Assistant:

inline
bool SetGenericProperty(std::map< unsigned int, T >& list,
        const char* szName, const T& value) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T>::iterator it = list.find(hash);
    if (it == list.end())   {
        list.insert(std::pair<unsigned int, T>( hash, value ));
        return false;
    }
    (*it).second = value;

    return true;
}